

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inferdeclnode.cpp
# Opt level: O3

void __thiscall
InferDeclNode::check
          (InferDeclNode *this,
          vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
          *tables)

{
  pointer pmVar1;
  VarNode *pVVar2;
  bool bVar3;
  runtime_error *this_00;
  long *plVar4;
  char *pcVar5;
  size_type *psVar6;
  string varScope;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  string local_170;
  string local_150;
  string local_130;
  SymbolInfo local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
  local_b0;
  
  bVar3 = wasDeclared(tables,&((this->lhs)._M_t.
                               super___uniq_ptr_impl<VarNode,_std::default_delete<VarNode>_>._M_t.
                               super__Tuple_impl<0UL,_VarNode_*,_std::default_delete<VarNode>_>.
                               super__Head_base<0UL,_VarNode_*,_false>._M_head_impl)->name);
  if (!bVar3) {
    local_188 = 0;
    local_180 = 0;
    pcVar5 = "local";
    if ((long)(tables->
              super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(tables->
              super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start == 0x30) {
      pcVar5 = "global";
    }
    local_190 = &local_180;
    std::__cxx11::string::_M_replace((ulong)&local_190,0,(char *)0x0,(ulong)pcVar5);
    pmVar1 = (tables->
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pVVar2 = (this->lhs)._M_t.super___uniq_ptr_impl<VarNode,_std::default_delete<VarNode>_>._M_t.
             super__Tuple_impl<0UL,_VarNode_*,_std::default_delete<VarNode>_>.
             super__Head_base<0UL,_VarNode_*,_false>._M_head_impl;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"var","");
    (*((this->rhs)._M_t.super___uniq_ptr_impl<ASTNode,_std::default_delete<ASTNode>_>._M_t.
       super__Tuple_impl<0UL,_ASTNode_*,_std::default_delete<ASTNode>_>.
       super__Head_base<0UL,_ASTNode_*,_false>._M_head_impl)->_vptr_ASTNode[6])(&local_130);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_170,local_190,local_190 + local_188);
    SymbolInfo::SymbolInfo(&local_110,&local_150,&local_130,&local_170);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_SymbolInfo,_true>
              (&local_b0,&pVVar2->name,&local_110);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,SymbolInfo>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
                *)(pmVar1 + -1),&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.scope._M_dataplus._M_p != &local_b0.second.scope.field_2) {
      operator_delete(local_b0.second.scope._M_dataplus._M_p,
                      local_b0.second.scope.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.type._M_dataplus._M_p != &local_b0.second.type.field_2) {
      operator_delete(local_b0.second.type._M_dataplus._M_p,
                      local_b0.second.type.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.kind._M_dataplus._M_p != &local_b0.second.kind.field_2) {
      operator_delete(local_b0.second.kind._M_dataplus._M_p,
                      local_b0.second.kind.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
      operator_delete(local_b0.first._M_dataplus._M_p,
                      local_b0.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.scope._M_dataplus._M_p != &local_110.scope.field_2) {
      operator_delete(local_110.scope._M_dataplus._M_p,
                      local_110.scope.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.type._M_dataplus._M_p != &local_110.type.field_2) {
      operator_delete(local_110.type._M_dataplus._M_p,
                      local_110.type.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.kind._M_dataplus._M_p != &local_110.kind.field_2) {
      operator_delete(local_110.kind._M_dataplus._M_p,
                      local_110.kind.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_110.kind,"error: multiple definition of \'",
                 &((this->lhs)._M_t.super___uniq_ptr_impl<VarNode,_std::default_delete<VarNode>_>.
                   _M_t.super__Tuple_impl<0UL,_VarNode_*,_std::default_delete<VarNode>_>.
                   super__Head_base<0UL,_VarNode_*,_false>._M_head_impl)->name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_b0.first._M_dataplus._M_p = (pointer)*plVar4;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_b0.first._M_dataplus._M_p == psVar6) {
    local_b0.first.field_2._M_allocated_capacity = *psVar6;
    local_b0.first.field_2._8_8_ = plVar4[3];
    local_b0.first._M_dataplus._M_p = (pointer)&local_b0.first.field_2;
  }
  else {
    local_b0.first.field_2._M_allocated_capacity = *psVar6;
  }
  local_b0.first._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_b0);
  *(undefined ***)this_00 = &PTR__runtime_error_00139738;
  __cxa_throw(this_00,&SemanticException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void InferDeclNode::check(std::vector<SymbolTable>& tables) {
    if (wasDeclared(tables, lhs->name)) {
        throw SemanticException("error: multiple definition of '" + lhs->name + "'");
    } else {
        auto varScope = std::string();
        if (tables.size() == 1) {
            varScope = "global";
        } else {
            varScope = "local";
        }

        tables.back().emplace(std::make_pair(lhs->name, SymbolInfo("var", rhs->getType(), varScope)));
//        std::cout << "new var added to table: named " << lhs->name << ", type: "
//                  << rhs->getType() << ", scope: " << varScope << "\n";
    }
}